

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O3

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *pGVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer pcVar4;
  pointer pcVar5;
  undefined8 uVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  bool bVar8;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar9;
  uint uVar10;
  pointer piVar11;
  cmGraphEdge *ni;
  ulong uVar12;
  pointer pcVar13;
  int head;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  int local_d4;
  vector<int,_std::allocator<int>_> *local_d0;
  cmComputeTargetDepends *local_c8;
  undefined8 local_c0;
  ulong local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> *local_78;
  cmComputeComponentGraph *local_70;
  Graph *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  pGVar1 = &this->FinalGraph;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  local_68 = pGVar1;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&pGVar1->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_b0 = &this->ComponentHead;
  std::vector<int,_std::allocator<int>_>::resize
            (local_b0,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_78 = &this->ComponentTail;
  local_c8 = this;
  std::vector<int,_std::allocator<int>_>::resize
            (local_78,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar10 = (int)((long)(ccg->Components).
                       super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(ccg->Components).
                       super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if ((int)uVar10 < 1) {
    uVar9 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  else {
    local_d0 = &ccg->TarjanComponents;
    local_b8 = (ulong)(uVar10 & 0x7fffffff);
    uVar12 = 0;
    uVar9 = 0;
    do {
      local_d4 = -1;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      pcVar2 = (ccg->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)
                &pcVar2[uVar12].super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      uVar6 = local_c0;
      for (piVar11 = *(pointer *)
                      ((long)&pcVar2[uVar12].super_vector<int,_std::allocator<int>_>.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
          local_c0 = uVar9, piVar11 != piVar3; piVar11 = piVar11 + -1) {
        local_a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_a8._M_impl.super__Rb_tree_header._M_header;
        local_a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_a8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_a8._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar8 = IntraComponent(local_c8,local_d0,(int)uVar12,piVar11[-1],&local_d4,
                               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60,
                               (set<int,_std::less<int>,_std::allocator<int>_> *)&local_a8);
        if (!bVar8) {
          ComplainAboutBadComponent(local_c8,ccg,(int)uVar12,true);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_a8);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree(&local_60);
          goto LAB_002d8323;
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_a8);
        uVar9 = local_c0;
        uVar6 = local_c0;
      }
      (local_b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar12] = local_d4;
      local_c0 = uVar6;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      uVar12 = uVar12 + 1;
      uVar9 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),local_b8 <= uVar12);
    } while (uVar12 != local_b8);
  }
  pGVar1 = local_68;
  uVar10 = (int)((long)(ccg->ComponentGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)(ccg->ComponentGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_c0 = uVar9;
  if (0 < (int)uVar10) {
    local_b8 = (ulong)(uVar10 & 0x7fffffff);
    local_d0 = (vector<int,_std::allocator<int>_> *)0x0;
    local_70 = ccg;
    do {
      pvVar7 = local_b0;
      pcVar4 = (local_70->ComponentGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar13 = *(pointer *)
                 &pcVar4[(long)local_d0].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar5 = *(pointer *)
                ((long)&pcVar4[(long)local_d0].
                        super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                        super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8);
      if (pcVar13 != pcVar5) {
        local_c8 = (cmComputeTargetDepends *)
                   ((long)(local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[(long)local_d0] * 0x18);
        do {
          local_60._M_impl._0_4_ =
               (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar13->Dest];
          local_a8._M_impl._0_1_ = pcVar13->Strong;
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int&,bool,cmListFileBacktrace_const&>
                    ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                     ((long)&(((pGVar1->
                               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> +
                     (long)local_c8),(int *)&local_60,(bool *)&local_a8,&pcVar13->Backtrace);
          pcVar13 = pcVar13 + 1;
        } while (pcVar13 != pcVar5);
      }
      local_d0 = (vector<int,_std::allocator<int>_> *)((long)local_d0 + 1);
    } while (local_d0 != (vector<int,_std::allocator<int>_> *)local_b8);
  }
LAB_002d8323:
  return (bool)((byte)local_c0 & 1);
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (int ni : cmReverseRange(nl)) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      int dependee_component = ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.GetBacktrace());
    }
  }
  return true;
}